

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EmissionSystem::Decode(EmissionSystem *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  byte bVar2;
  EmitterBeam local_a8;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x13 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8SystemDataLength);
    KDataStream::Read(stream,&this->m_ui8NumberOfBeams);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    (*(this->m_EmitterSystemRecord).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EmitterSystemRecord,stream);
    (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Location,stream);
    if (this->m_ui8NumberOfBeams != '\0') {
      bVar2 = 0;
      do {
        EmitterBeam::EmitterBeam(&local_a8,stream);
        std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::
        emplace_back<KDIS::DATA_TYPE::EmitterBeam>(&this->m_vEmitterBeams,&local_a8);
        EmitterBeam::~EmitterBeam(&local_a8);
        bVar2 = bVar2 + 1;
      } while (bVar2 < this->m_ui8NumberOfBeams);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_a8.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&local_a8.m_FundamentalParameterData;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Decode","");
  KException::KException(this_00,(KString *)&local_a8,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EmissionSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < EMISSION_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8SystemDataLength
           >> m_ui8NumberOfBeams
           >> m_ui16Padding
           >> KDIS_STREAM m_EmitterSystemRecord
           >> KDIS_STREAM m_Location;

    for( KUINT8 i = 0; i < m_ui8NumberOfBeams; ++i )
    {
        m_vEmitterBeams.push_back( EmitterBeam( stream ) );
    }
}